

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latex.hpp
# Opt level: O0

void __thiscall
viennamath::rt_latex_translator<viennamath::rt_expression_interface<double>_>::~rt_latex_translator
          (rt_latex_translator<viennamath::rt_expression_interface<double>_> *this)

{
  bool bVar1;
  reference pprVar2;
  __normal_iterator<viennamath::rt_latex_processor_interface<viennamath::rt_expression_interface<double>_>_**,_std::vector<viennamath::rt_latex_processor_interface<viennamath::rt_expression_interface<double>_>_*,_std::allocator<viennamath::rt_latex_processor_interface<viennamath::rt_expression_interface<double>_>_*>_>_>
  local_20;
  __normal_iterator<viennamath::rt_latex_processor_interface<viennamath::rt_expression_interface<double>_>_**,_std::vector<viennamath::rt_latex_processor_interface<viennamath::rt_expression_interface<double>_>_*,_std::allocator<viennamath::rt_latex_processor_interface<viennamath::rt_expression_interface<double>_>_*>_>_>
  local_18;
  iterator it;
  rt_latex_translator<viennamath::rt_expression_interface<double>_> *this_local;
  
  it._M_current =
       (rt_latex_processor_interface<viennamath::rt_expression_interface<double>_> **)this;
  local_18._M_current =
       (rt_latex_processor_interface<viennamath::rt_expression_interface<double>_> **)
       std::
       vector<viennamath::rt_latex_processor_interface<viennamath::rt_expression_interface<double>_>_*,_std::allocator<viennamath::rt_latex_processor_interface<viennamath::rt_expression_interface<double>_>_*>_>
       ::begin(&this->processors_);
  while( true ) {
    local_20._M_current =
         (rt_latex_processor_interface<viennamath::rt_expression_interface<double>_> **)
         std::
         vector<viennamath::rt_latex_processor_interface<viennamath::rt_expression_interface<double>_>_*,_std::allocator<viennamath::rt_latex_processor_interface<viennamath::rt_expression_interface<double>_>_*>_>
         ::end(&this->processors_);
    bVar1 = __gnu_cxx::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    pprVar2 = __gnu_cxx::
              __normal_iterator<viennamath::rt_latex_processor_interface<viennamath::rt_expression_interface<double>_>_**,_std::vector<viennamath::rt_latex_processor_interface<viennamath::rt_expression_interface<double>_>_*,_std::allocator<viennamath::rt_latex_processor_interface<viennamath::rt_expression_interface<double>_>_*>_>_>
              ::operator*(&local_18);
    if (*pprVar2 !=
        (rt_latex_processor_interface<viennamath::rt_expression_interface<double>_> *)0x0) {
      (*(*pprVar2)->_vptr_rt_latex_processor_interface[4])();
    }
    __gnu_cxx::
    __normal_iterator<viennamath::rt_latex_processor_interface<viennamath::rt_expression_interface<double>_>_**,_std::vector<viennamath::rt_latex_processor_interface<viennamath::rt_expression_interface<double>_>_*,_std::allocator<viennamath::rt_latex_processor_interface<viennamath::rt_expression_interface<double>_>_*>_>_>
    ::operator++(&local_18);
  }
  std::
  vector<viennamath::rt_latex_processor_interface<viennamath::rt_expression_interface<double>_>_*,_std::allocator<viennamath::rt_latex_processor_interface<viennamath::rt_expression_interface<double>_>_*>_>
  ::~vector(&this->processors_);
  return;
}

Assistant:

~rt_latex_translator()
      {
        for (typename ProcessorArray::iterator it = processors_.begin();
                                               it != processors_.end();
                                             ++it)
        {
          delete *it;
        }
      }